

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(ostream *os,string *s)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  char *pcVar5;
  
  std::operator<<(os,'\"');
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  sVar4 = 0;
  do {
    if (sVar3 == sVar4) {
      std::operator<<(os,'\"');
      return;
    }
    cVar1 = pcVar2[sVar4];
    if (cVar1 == '\"') {
      pcVar5 = "\\\"";
LAB_003401be:
      std::operator<<(os,pcVar5);
    }
    else {
      if (cVar1 == '\\') {
        pcVar5 = "\\\\";
        goto LAB_003401be;
      }
      std::operator<<(os,cVar1);
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(std::ostream& os,
                                                       const std::string& s)
{
  // Write the given string to the stream with escaping to get it back
  // into CMake through the lexical scanner.
  os << '"';
  for (char c : s) {
    if (c == '\\') {
      os << "\\\\";
    } else if (c == '"') {
      os << "\\\"";
    } else {
      os << c;
    }
  }
  os << '"';
}